

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

Type __thiscall wasm::TypeBuilder::getTempTupleType(TypeBuilder *this,Tuple *tuple)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> this_00;
  type_t tVar1;
  TypeInfo local_38;
  
  this_00._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  local_38.isTemp = false;
  local_38.kind = TupleKind;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_38.field_2.tuple.types,&tuple->types);
  tVar1 = anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                    (&(this_00._M_head_impl)->typeStore,&local_38);
  anon_unknown_0::TypeInfo::~TypeInfo(&local_38);
  if (6 < tVar1.id &&
      8 < (ulong)((long)(tuple->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(tuple->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    *(undefined1 *)tVar1.id = 1;
  }
  return (Type)tVar1.id;
}

Assistant:

Type TypeBuilder::getTempTupleType(const Tuple& tuple) {
  Type ret = impl->typeStore.insert(tuple);
  if (tuple.types.size() > 1) {
    return markTemp(ret);
  } else {
    // No new tuple was created, so the result might not be temporary.
    return ret;
  }
}